

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::CheckDoubleMinimum
          (Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
           *this,Context *context,double d)

{
  ValueType *this_00;
  Ch *pCVar1;
  ValidateErrorCode VVar2;
  double dVar3;
  double d_local;
  Context *context_local;
  Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *this_local;
  
  if ((this->exclusiveMinimum_ & 1U) == 0) {
    dVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetDouble(&this->minimum_)
    ;
    if (d < dVar3) goto LAB_00185929;
  }
  else {
    dVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetDouble(&this->minimum_)
    ;
    if (d <= dVar3) {
LAB_00185929:
      (*context->error_handler->_vptr_IValidationErrorHandler[10])
                (d,context->error_handler,&this->minimum_,(ulong)this->exclusiveMinimum_ & 1);
      VVar2 = kValidateErrorMinimum;
      if ((this->exclusiveMinimum_ & 1U) != 0) {
        VVar2 = kValidateErrorExclusiveMinimum;
      }
      context->invalidCode = VVar2;
      VVar2 = kValidateErrorMinimum;
      if ((this->exclusiveMinimum_ & 1U) != 0) {
        VVar2 = kValidateErrorExclusiveMinimum;
      }
      this_00 = GetValidateErrorKeyword(VVar2);
      pCVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(this_00);
      context->invalidKeyword = pCVar1;
      return false;
    }
  }
  return true;
}

Assistant:

bool CheckDoubleMinimum(Context& context, double d) const {
        if (exclusiveMinimum_ ? d <= minimum_.GetDouble() : d < minimum_.GetDouble()) {
            context.error_handler.BelowMinimum(d, minimum_, exclusiveMinimum_);
            RAPIDJSON_INVALID_KEYWORD_RETURN(exclusiveMinimum_ ? kValidateErrorExclusiveMinimum : kValidateErrorMinimum);
        }
        return true;
    }